

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

char * point_basename(char *path)

{
  size_t sVar1;
  char *in_RDI;
  size_t step;
  char *p;
  char *b;
  char *local_18;
  char *local_10;
  
  local_10 = in_RDI;
  for (local_18 = in_RDI; *local_18 != '\0'; local_18 = local_18 + 1) {
    sVar1 = GetUTF8Length(*local_18);
    if (sVar1 < 2) {
      if ((*local_18 == *G_BACKSLASH_CHAR) || (*local_18 == *G_FORWARD_SLASH_CHAR)) {
        local_10 = local_18 + 1;
      }
    }
    else {
      local_18 = local_18 + (sVar1 - 1);
    }
  }
  return local_10;
}

Assistant:

char *point_basename(const char *path)
{
	const char *b = path;
	const char *p;
	for (p = b; *p; p++)
	{
		size_t step = GetUTF8Length(*p);
		if (step > 1)
		{
			p += step - 1;
			continue;
		}
		if ((*p == *G_BACKSLASH_CHAR) || (*p == *G_FORWARD_SLASH_CHAR))
		{
			b = p + 1;
		}
	}
	return (char *)b;
}